

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O2

uhugeint_t __thiscall
duckdb::NumericCastImpl<duckdb::uhugeint_t,_duckdb::hugeint_t,_false>::Convert
          (NumericCastImpl<duckdb::uhugeint_t,_duckdb::hugeint_t,_false> *this,hugeint_t val)

{
  hugeint_t params;
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  InternalException *this_00;
  uhugeint_t uVar4;
  uhugeint_t params_1;
  allocator local_e9;
  hugeint_t val_local;
  type unsigned_max;
  type unsigned_in;
  type signed_min;
  string local_88;
  type signed_in;
  uhugeint_t local_58;
  uhugeint_t minval;
  
  val_local.upper = val.lower;
  minval.lower = 0;
  minval.upper = 0;
  local_58.lower._0_4_ = 0xffffffff;
  local_58.lower._4_4_ = 0xffffffff;
  local_58.upper._0_4_ = 0xffffffff;
  local_58.upper._4_4_ = 0xffffffff;
  val_local.lower = (uint64_t)this;
  unsigned_in = hugeint_t::operator_cast_to_uhugeint_t(&val_local);
  unsigned_max.lower = CONCAT44(local_58.lower._4_4_,(undefined4)local_58.lower);
  unsigned_max.upper = CONCAT44(local_58.upper._4_4_,(undefined4)local_58.upper);
  signed_in.lower = val_local.lower;
  signed_in.upper = val_local.upper;
  signed_min = uhugeint_t::operator_cast_to_hugeint_t(&minval);
  uhugeint_t::operator_cast_to_hugeint_t(&local_58);
  bVar3 = hugeint_t::operator<(&signed_in,&signed_min);
  if (!bVar3) {
    bVar3 = uhugeint_t::operator>(&unsigned_in,&unsigned_max);
    if (!bVar3) {
      uVar4 = hugeint_t::operator_cast_to_uhugeint_t(&val_local);
      return uVar4;
    }
  }
  params.upper = val_local.upper;
  params.lower = val_local.lower;
  params_1 = hugeint_t::operator_cast_to_uhugeint_t(&signed_min);
  uVar2 = unsigned_max.upper;
  uVar1 = unsigned_max.lower;
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_88,
             "Information loss on integer cast: value %d outside of target range [%d, %d]",&local_e9
            );
  uVar4.upper = uVar2;
  uVar4.lower = uVar1;
  InternalException::InternalException<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
            (this_00,&local_88,params,params_1,uVar4);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static TO Convert(FROM val) {
		// some dance around signed-unsigned integer comparison below
		auto minval = NumericLimits<TO>::Minimum();
		auto maxval = NumericLimits<TO>::Maximum();
		auto unsigned_in = static_cast<typename MakeUnsigned<FROM>::type>(val);
		auto unsigned_min = static_cast<typename MakeUnsigned<TO>::type>(minval);
		auto unsigned_max = static_cast<typename MakeUnsigned<TO>::type>(maxval);
		auto signed_in = static_cast<typename MakeSigned<FROM>::type>(val);
		auto signed_min = static_cast<typename MakeSigned<TO>::type>(minval);
		auto signed_max = static_cast<typename MakeSigned<TO>::type>(maxval);

		if (!NumericLimits<FROM>::IsSigned() && !NumericLimits<TO>::IsSigned() &&
		    (unsigned_in < unsigned_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(unsigned_min), static_cast<TO>(unsigned_max));
		}

		if (NumericLimits<FROM>::IsSigned() && NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || signed_in > signed_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(signed_max));
		}

		if (NumericLimits<FROM>::IsSigned() != NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(unsigned_max));
		}

		return static_cast<TO>(val);
	}